

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void write_bytes<double>(void *ptr,size_t n_els,ostream *out)

{
  ulong uVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  
  if (in_RSI != 0) {
    std::ostream::write(in_RDX,in_RDI);
    uVar1 = std::ios::bad();
    if ((uVar1 & 1) != 0) {
      throw_errno();
    }
  }
  return;
}

Assistant:

void write_bytes(const void *ptr, const size_t n_els, std::ostream &out)
{
    if (n_els == 0) return;
    out.write((char*)ptr, n_els * sizeof(dtype));
    if (unlikely(out.bad())) throw_errno();
}